

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFill.cpp
# Opt level: O2

bool __thiscall CDirectiveFill::Validate(CDirectiveFill *this)

{
  bool bVar1;
  undefined8 in_RAX;
  u64 uVar2;
  int NewSize;
  
  NewSize = (int)((ulong)in_RAX >> 0x20);
  uVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar2;
  bVar1 = evalExpression(&this->SizeExpression,&NewSize,true);
  if ((bVar1) &&
     (((this->FillByte != true ||
       (bVar1 = evalExpression(&this->ByteExpression,&this->Byte,true), bVar1)) &&
      (FileManager::advanceMemory(g_fileManager,(long)NewSize), this->Size != (long)NewSize)))) {
    this->Size = (ulong)(uint)NewSize;
    return true;
  }
  return false;
}

Assistant:

bool CDirectiveFill::Validate()
{
	int NewSize;

	RamPos = g_fileManager->getVirtualAddress();
	if (evalExpression(SizeExpression,NewSize,true) == false)
		return false;

	if (FillByte == true)
	{
		if (evalExpression(ByteExpression,Byte,true) == false)
			return false;
	}

	g_fileManager->advanceMemory(NewSize);

	if (Size != NewSize)
	{
		Size = (u32)NewSize;
		return true;
	} else {
		return false;
	}
}